

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O0

bool __thiscall cmListFileParser::ParseFunction(cmListFileParser *this,char *name,long line)

{
  cmMessenger *this_00;
  cmListFileLexer_Token *pcVar1;
  ostream *poVar2;
  char *pcVar3;
  bool bVar4;
  string local_7a8;
  cmListFileContext local_788;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_718;
  undefined1 local_708 [8];
  cmListFileBacktrace lfbt;
  cmListFileContext lfc;
  ostringstream error;
  string local_510;
  ostringstream local_4f0 [8];
  ostringstream error_3;
  long local_378;
  unsigned_long parenDepth;
  ostringstream local_350 [8];
  ostringstream error_2;
  string local_1d8;
  ostringstream local_1a8 [8];
  ostringstream error_1;
  cmListFileLexer_Token *token;
  long line_local;
  char *name_local;
  cmListFileParser *this_local;
  
  std::__cxx11::string::operator=((string *)&this->FunctionName,name);
  this->FunctionLine = line;
  do {
    pcVar1 = cmListFileLexer_Scan(this->Lexer);
    bVar4 = false;
    if (pcVar1 != (cmListFileLexer_Token *)0x0) {
      bVar4 = pcVar1->type == cmListFileLexer_Token_Space;
    }
  } while (bVar4);
  if (pcVar1 == (cmListFileLexer_Token *)0x0) {
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    poVar2 = std::operator<<((ostream *)local_1a8,"Unexpected end of file.\n");
    std::operator<<(poVar2,"Parse error.  Function missing opening \"(\".");
    std::__cxx11::ostringstream::str();
    IssueError(this,&local_1d8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
  }
  else if (pcVar1->type == cmListFileLexer_Token_ParenLeft) {
    local_378 = 0;
    this->Separation = SeparationOkay;
    do {
      while( true ) {
        while( true ) {
          pcVar1 = cmListFileLexer_Scan(this->Lexer);
          if (pcVar1 == (cmListFileLexer_Token *)0x0) {
            std::__cxx11::ostringstream::ostringstream
                      ((ostringstream *)
                       &lfc.DeferId.
                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ._M_engaged);
            cmListFileContext::cmListFileContext
                      ((cmListFileContext *)
                       &lfbt.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
            std::__cxx11::string::operator=
                      ((string *)(lfc.Name.field_2._M_local_buf + 8),this->FileName);
            lfc.FilePath.field_2._8_8_ = line;
            cmListFileBacktrace::cmListFileBacktrace
                      ((cmListFileBacktrace *)local_708,&this->Backtrace);
            cmListFileContext::cmListFileContext
                      (&local_788,
                       (cmListFileContext *)
                       &lfbt.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
            cmConstStack<cmListFileContext,_cmListFileBacktrace>::Push
                      (&local_718,(cmListFileContext *)local_708);
            cmListFileBacktrace::operator=
                      ((cmListFileBacktrace *)local_708,(cmListFileBacktrace *)&local_718);
            cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&local_718);
            cmListFileContext::~cmListFileContext(&local_788);
            poVar2 = std::operator<<((ostream *)
                                     &lfc.DeferId.
                                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                      ._M_payload.
                                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                      .
                                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ._M_engaged,"Parse error.  Function missing ending \")\".  ");
            std::operator<<(poVar2,"End of file reached.");
            this_00 = this->Messenger;
            std::__cxx11::ostringstream::str();
            cmMessenger::IssueMessage
                      (this_00,FATAL_ERROR,&local_7a8,(cmListFileBacktrace *)local_708);
            std::__cxx11::string::~string((string *)&local_7a8);
            cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_708);
            cmListFileContext::~cmListFileContext
                      ((cmListFileContext *)
                       &lfbt.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
            std::__cxx11::ostringstream::~ostringstream
                      ((ostringstream *)
                       &lfc.DeferId.
                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ._M_engaged);
            return false;
          }
          if ((pcVar1->type != cmListFileLexer_Token_Space) &&
             (pcVar1->type != cmListFileLexer_Token_Newline)) break;
          this->Separation = SeparationOkay;
        }
        if (pcVar1->type == cmListFileLexer_Token_ParenLeft) break;
        if (pcVar1->type == cmListFileLexer_Token_ParenRight) {
          if (local_378 == 0) {
            this->FunctionLineEnd = (long)pcVar1->line;
            return true;
          }
          local_378 = local_378 + -1;
          this->Separation = SeparationOkay;
          bVar4 = AddArgument(this,pcVar1,Unquoted);
          if (!bVar4) {
            return false;
          }
          this->Separation = SeparationWarning;
        }
        else if ((pcVar1->type == cmListFileLexer_Token_Identifier) ||
                (pcVar1->type == cmListFileLexer_Token_ArgumentUnquoted)) {
          bVar4 = AddArgument(this,pcVar1,Unquoted);
          if (!bVar4) {
            return false;
          }
          this->Separation = SeparationWarning;
        }
        else if (pcVar1->type == cmListFileLexer_Token_ArgumentQuoted) {
          bVar4 = AddArgument(this,pcVar1,Quoted);
          if (!bVar4) {
            return false;
          }
          this->Separation = SeparationWarning;
        }
        else if (pcVar1->type == cmListFileLexer_Token_ArgumentBracket) {
          bVar4 = AddArgument(this,pcVar1,Bracket);
          if (!bVar4) {
            return false;
          }
          this->Separation = SeparationError;
        }
        else {
          if (pcVar1->type != cmListFileLexer_Token_CommentBracket) {
            std::__cxx11::ostringstream::ostringstream(local_4f0);
            poVar2 = std::operator<<((ostream *)local_4f0,
                                     "Parse error.  Function missing ending \")\".  ");
            poVar2 = std::operator<<(poVar2,"Instead found ");
            pcVar3 = cmListFileLexer_GetTypeAsString(this->Lexer,pcVar1->type);
            poVar2 = std::operator<<(poVar2,pcVar3);
            poVar2 = std::operator<<(poVar2," with text \"");
            poVar2 = std::operator<<(poVar2,pcVar1->text);
            std::operator<<(poVar2,"\".");
            std::__cxx11::ostringstream::str();
            IssueError(this,&local_510);
            std::__cxx11::string::~string((string *)&local_510);
            std::__cxx11::ostringstream::~ostringstream(local_4f0);
            return false;
          }
          this->Separation = SeparationError;
        }
      }
      local_378 = local_378 + 1;
      this->Separation = SeparationOkay;
      bVar4 = AddArgument(this,pcVar1,Unquoted);
    } while (bVar4);
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_350);
    poVar2 = std::operator<<((ostream *)local_350,"Parse error.  Expected \"(\", got ");
    pcVar3 = cmListFileLexer_GetTypeAsString(this->Lexer,pcVar1->type);
    poVar2 = std::operator<<(poVar2,pcVar3);
    poVar2 = std::operator<<(poVar2," with text \"");
    poVar2 = std::operator<<(poVar2,pcVar1->text);
    std::operator<<(poVar2,"\".");
    std::__cxx11::ostringstream::str();
    IssueError(this,(string *)&parenDepth);
    std::__cxx11::string::~string((string *)&parenDepth);
    std::__cxx11::ostringstream::~ostringstream(local_350);
  }
  return false;
}

Assistant:

bool cmListFileParser::ParseFunction(const char* name, long line)
{
  // Ininitialize a new function call.
  this->FunctionName = name;
  this->FunctionLine = line;

  // Command name has already been parsed.  Read the left paren.
  cmListFileLexer_Token* token;
  while ((token = cmListFileLexer_Scan(this->Lexer)) &&
         token->type == cmListFileLexer_Token_Space) {
  }
  if (!token) {
    std::ostringstream error;
    /* clang-format off */
    error << "Unexpected end of file.\n"
          << "Parse error.  Function missing opening \"(\".";
    /* clang-format on */
    this->IssueError(error.str());
    return false;
  }
  if (token->type != cmListFileLexer_Token_ParenLeft) {
    std::ostringstream error;
    error << "Parse error.  Expected \"(\", got "
          << cmListFileLexer_GetTypeAsString(this->Lexer, token->type)
          << " with text \"" << token->text << "\".";
    this->IssueError(error.str());
    return false;
  }

  // Arguments.
  unsigned long parenDepth = 0;
  this->Separation = SeparationOkay;
  while ((token = cmListFileLexer_Scan(this->Lexer))) {
    if (token->type == cmListFileLexer_Token_Space ||
        token->type == cmListFileLexer_Token_Newline) {
      this->Separation = SeparationOkay;
      continue;
    }
    if (token->type == cmListFileLexer_Token_ParenLeft) {
      parenDepth++;
      this->Separation = SeparationOkay;
      if (!this->AddArgument(token, cmListFileArgument::Unquoted)) {
        return false;
      }
    } else if (token->type == cmListFileLexer_Token_ParenRight) {
      if (parenDepth == 0) {
        this->FunctionLineEnd = token->line;
        return true;
      }
      parenDepth--;
      this->Separation = SeparationOkay;
      if (!this->AddArgument(token, cmListFileArgument::Unquoted)) {
        return false;
      }
      this->Separation = SeparationWarning;
    } else if (token->type == cmListFileLexer_Token_Identifier ||
               token->type == cmListFileLexer_Token_ArgumentUnquoted) {
      if (!this->AddArgument(token, cmListFileArgument::Unquoted)) {
        return false;
      }
      this->Separation = SeparationWarning;
    } else if (token->type == cmListFileLexer_Token_ArgumentQuoted) {
      if (!this->AddArgument(token, cmListFileArgument::Quoted)) {
        return false;
      }
      this->Separation = SeparationWarning;
    } else if (token->type == cmListFileLexer_Token_ArgumentBracket) {
      if (!this->AddArgument(token, cmListFileArgument::Bracket)) {
        return false;
      }
      this->Separation = SeparationError;
    } else if (token->type == cmListFileLexer_Token_CommentBracket) {
      this->Separation = SeparationError;
    } else {
      // Error.
      std::ostringstream error;
      error << "Parse error.  Function missing ending \")\".  "
            << "Instead found "
            << cmListFileLexer_GetTypeAsString(this->Lexer, token->type)
            << " with text \"" << token->text << "\".";
      this->IssueError(error.str());
      return false;
    }
  }

  std::ostringstream error;
  cmListFileContext lfc;
  lfc.FilePath = this->FileName;
  lfc.Line = line;
  cmListFileBacktrace lfbt = this->Backtrace;
  lfbt = lfbt.Push(lfc);
  error << "Parse error.  Function missing ending \")\".  "
        << "End of file reached.";
  this->Messenger->IssueMessage(MessageType::FATAL_ERROR, error.str(), lfbt);
  return false;
}